

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::Base64EncodeFile(string *__return_storage_ptr__,cmCTest *this,string *file)

{
  unsigned_long length;
  uchar *input;
  uchar *output;
  size_t sVar1;
  size_t i;
  size_t sVar2;
  allocator local_231;
  ifstream ifs;
  
  length = cmsys::SystemTools::FileLength(file);
  std::ifstream::ifstream(&ifs,(file->_M_dataplus)._M_p,_S_in);
  input = (uchar *)operator_new__(length + 1);
  std::istream::read((char *)&ifs,(long)input);
  std::ifstream::close();
  output = (uchar *)operator_new__((length * 3 >> 1) + 5);
  sVar1 = cmsysBase64_Encode(input,length,output,1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_231);
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  operator_delete__(input);
  operator_delete__(output);
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::Base64EncodeFile(std::string file)
{
  size_t const len = cmSystemTools::FileLength(file);
  cmsys::ifstream ifs(file.c_str(), std::ios::in
#ifdef _WIN32
    | std::ios::binary
#endif
    );
  unsigned char *file_buffer = new unsigned char [ len + 1 ];
  ifs.read(reinterpret_cast<char*>(file_buffer), len);
  ifs.close();

  unsigned char *encoded_buffer
    = new unsigned char [ (len * 3) / 2 + 5 ];

  size_t const rlen
    = cmsysBase64_Encode(file_buffer, len, encoded_buffer, 1);

  std::string base64 = "";
  for(size_t i = 0; i < rlen; i++)
    {
    base64 += encoded_buffer[i];
    }
  delete [] file_buffer;
  delete [] encoded_buffer;

  return base64;
}